

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLUri::initializeAuthority(XMLUri *this,XMLCh *uriSpec)

{
  bool bVar1;
  int iVar2;
  XMLSize_t XVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *pXVar4;
  int local_b0;
  int local_8c;
  undefined1 local_88 [4];
  int port;
  ArrayJanitor<char16_t> portName;
  XMLCh *portStr;
  ArrayJanitor<char16_t> hostName;
  XMLCh *host;
  undefined1 local_48 [8];
  ArrayJanitor<char16_t> userName;
  XMLCh *userinfo;
  XMLSize_t end;
  XMLSize_t start;
  int index;
  XMLCh *uriSpec_local;
  XMLUri *this_local;
  
  end = 0;
  XVar3 = XMLString::stringLen(uriSpec);
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,XVar3 * 2 + 2);
  userName.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var,iVar2);
  ArrayJanitor<char16_t>::ArrayJanitor
            ((ArrayJanitor<char16_t> *)local_48,(char16_t *)userName.fMemoryManager,
             this->fMemoryManager);
  iVar2 = XMLString::indexOf(uriSpec,L'@');
  if (iVar2 == -1) {
    userName.fMemoryManager = (MemoryManager *)0x0;
  }
  else {
    XMLString::subString
              ((XMLCh *)userName.fMemoryManager,uriSpec,0,(long)iVar2,this->fMemoryManager);
    end = (XMLSize_t)(iVar2 + 1);
  }
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,XVar3 * 2 + 2);
  hostName.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var_00,iVar2);
  ArrayJanitor<char16_t>::ArrayJanitor
            ((ArrayJanitor<char16_t> *)&portStr,(char16_t *)hostName.fMemoryManager,
             this->fMemoryManager);
  if ((end < XVar3) && (uriSpec[end] == L'[')) {
    start._4_4_ = XMLString::indexOf(uriSpec + end,L']');
    if (start._4_4_ != -1) {
      if ((end + (long)start._4_4_ + 1 < XVar3) && (uriSpec[end + (long)start._4_4_ + 1] == L':')) {
        local_b0 = start._4_4_ + 1;
      }
      else {
        local_b0 = -1;
      }
      start._4_4_ = local_b0;
    }
  }
  else {
    start._4_4_ = XMLString::indexOf(uriSpec + end,L':');
  }
  if (start._4_4_ == -1) {
    XMLString::subString
              ((XMLCh *)hostName.fMemoryManager,uriSpec + end,0,XVar3 - end,this->fMemoryManager);
    end = XVar3;
  }
  else {
    XMLString::subString
              ((XMLCh *)hostName.fMemoryManager,uriSpec + end,0,(long)start._4_4_,
               this->fMemoryManager);
    start._4_4_ = start._4_4_ + 1;
    end = (long)start._4_4_ + end;
  }
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,XVar3 * 2 + 2);
  portName.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var_01,iVar2);
  ArrayJanitor<char16_t>::ArrayJanitor
            ((ArrayJanitor<char16_t> *)local_88,(char16_t *)portName.fMemoryManager,
             this->fMemoryManager);
  local_8c = -1;
  if ((((hostName.fMemoryManager != (MemoryManager *)0x0) &&
       (*(short *)&(hostName.fMemoryManager)->_vptr_MemoryManager != 0)) && (start._4_4_ != -1)) &&
     (((end < XVar3 &&
       (XMLString::subString
                  ((XMLCh *)portName.fMemoryManager,uriSpec + end,0,XVar3 - end,this->fMemoryManager
                  ), portName.fMemoryManager != (MemoryManager *)0x0)) &&
      (*(short *)&(portName.fMemoryManager)->_vptr_MemoryManager != 0)))) {
    local_8c = XMLString::parseInt((XMLCh *)portName.fMemoryManager,this->fMemoryManager);
  }
  bVar1 = isValidServerBasedAuthority
                    ((XMLCh *)hostName.fMemoryManager,local_8c,(XMLCh *)userName.fMemoryManager,
                     this->fMemoryManager);
  if (bVar1) {
    if (this->fHost != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fHost);
    }
    if (this->fUserInfo != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUserInfo);
    }
    pXVar4 = XMLString::replicate((XMLCh *)hostName.fMemoryManager,this->fMemoryManager);
    this->fHost = pXVar4;
    this->fPort = local_8c;
    pXVar4 = XMLString::replicate((XMLCh *)userName.fMemoryManager,this->fMemoryManager);
    this->fUserInfo = pXVar4;
  }
  else {
    setRegBasedAuthority(this,uriSpec);
  }
  ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_88);
  ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&portStr);
  ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_48);
  return;
}

Assistant:

void XMLUri::initializeAuthority(const XMLCh* const uriSpec)
{

    int index = 0;
    XMLSize_t start = 0;
    const XMLSize_t end = XMLString::stringLen(uriSpec);

    //
    // server = [ [ userinfo "@" ] hostport ]
    // userinfo is everything up @,
    //
    XMLCh* userinfo = (XMLCh*) fMemoryManager->allocate
    (
        (end+1) * sizeof(XMLCh)
    );//new XMLCh[end+1];
    ArrayJanitor<XMLCh> userName(userinfo, fMemoryManager);
    index = XMLString::indexOf(&(uriSpec[start]), chAt);

    if ( index != -1)
    {
        XMLString::subString(userinfo, &(uriSpec[start]), 0, index, fMemoryManager);
        index++; // skip the @
        start += index;
    }
    else
    {
        userinfo = 0;
    }

    //
    // hostport = host [ ":" port ]
    // host is everything up to ':', or up to
    // and including ']' if followed by ':'.
    //
    XMLCh* host = (XMLCh*) fMemoryManager->allocate
    (
        (end+1) * sizeof(XMLCh)
    );//new XMLCh[end+1];
    ArrayJanitor<XMLCh> hostName(host, fMemoryManager);

    // Search for port boundary.
    if (start < end && uriSpec[start] == chOpenSquare)
    {
    	index = XMLString::indexOf(&(uriSpec[start]), chCloseSquare);
    	if (index != -1)
    	{
            // skip the ']'
            index = ((start + index + 1) < end
              && uriSpec[start + index + 1] == chColon) ? index+1 : -1;
    	}
    }
    else
    {
        index = XMLString::indexOf(&(uriSpec[start]), chColon);
    }

    if ( index != -1 )
    {
        XMLString::subString(host, &(uriSpec[start]), 0, index, fMemoryManager);
        index++;  // skip the :
        start +=index;
    }
    else
    {
        XMLString::subString(host, &(uriSpec[start]), 0, end-start, fMemoryManager);
        start = end;
    }

    // port is everything after ":"

    XMLCh* portStr = (XMLCh*) fMemoryManager->allocate
    (
        (end+1) * sizeof(XMLCh)
    );//new XMLCh[end+1];
    ArrayJanitor<XMLCh> portName(portStr, fMemoryManager);
    int port = -1;

    if ((host && *host) &&   // non empty host
        (index != -1)                    &&   // ":" found
        (start < end)                     )   // ":" is not the last
    {
        XMLString::subString(portStr, &(uriSpec[start]), 0, end-start, fMemoryManager);

        if (portStr && *portStr)
        {
            port = XMLString::parseInt(portStr, fMemoryManager);
        }
    } // if > 0

    // Check if we have server based authority.
    if (isValidServerBasedAuthority(host, port, userinfo, fMemoryManager))
    {
        if (fHost)
            fMemoryManager->deallocate(fHost);//delete [] fHost;

        if (fUserInfo)
            fMemoryManager->deallocate(fUserInfo);//delete[] fUserInfo;

        fHost = XMLString::replicate(host, fMemoryManager);
        fPort = port;
        fUserInfo = XMLString::replicate(userinfo, fMemoryManager);

        return;
    }
    // This must be registry based authority or the URI is malformed.
    setRegBasedAuthority(uriSpec);
}